

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *p,Gia_Obj_t *pObj,int i)

{
  int iVar1;
  int i_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsPo(p,pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsXor(pObj);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjIsMux(p,pObj);
        if (iVar1 == 0) {
          iVar1 = Gia_ObjIsAnd(pObj);
          if (iVar1 == 0) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMuxes.c"
                          ,0x30d,"Gia_ObjType_t Gia_ManEncodeFanout(Gia_Man_t *, Gia_Obj_t *, int)")
            ;
          }
          p_local._4_4_ = oAND;
        }
        else {
          p_local._4_4_ = oMUXd;
          if (i == 2) {
            p_local._4_4_ = oMUXc;
          }
        }
      }
      else {
        p_local._4_4_ = oXOR;
      }
    }
    else {
      p_local._4_4_ = oFF;
    }
  }
  else {
    p_local._4_4_ = oPO;
  }
  return p_local._4_4_;
}

Assistant:

Gia_ObjType_t Gia_ManEncodeFanout( Gia_Man_t * p, Gia_Obj_t * pObj, int i )
{
//    int iLit;
    if ( Gia_ObjIsPo(p, pObj) )
        return oPO;
    if ( Gia_ObjIsCo(pObj) )
        return oFF;
    if ( Gia_ObjIsXor(pObj) )
        return oXOR;
    if ( Gia_ObjIsMux(p, pObj) )
        return i == 2 ? oMUXc : oMUXd;
    assert( Gia_ObjIsAnd(pObj) );
    return oAND;
//    iLit = i ? Gia_ObjFaninLit1p(p, pObj) : Gia_ObjFaninLit0p(p, pObj);
//    if ( Abc_LitIsCompl(iLit) )
//        return oANDn;
//    else
//        return oANDp;
}